

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subquery_expression.cpp
# Opt level: O2

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::SubqueryExpression::Copy(SubqueryExpression *this)

{
  SubqueryType SVar1;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> _Var2;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var3;
  size_type sVar4;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> _Var5;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var6;
  pointer pSVar7;
  pointer pSVar8;
  pointer pPVar9;
  pointer *__ptr;
  ParsedExpression *in_RSI;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> local_38;
  unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
  local_30;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_28;
  
  make_uniq<duckdb::SubqueryExpression>();
  pSVar7 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
           ::operator->(&local_30);
  ParsedExpression::CopyProperties(&pSVar7->super_ParsedExpression,in_RSI);
  pSVar8 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>::
           operator->((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                       *)(in_RSI + 1));
  (*(pSVar8->super_SQLStatement)._vptr_SQLStatement[3])(&local_38,pSVar8);
  _Var5._M_head_impl = local_38._M_head_impl;
  local_38._M_head_impl = (SelectStatement *)0x0;
  pSVar7 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
           ::operator->(&local_30);
  _Var2._M_head_impl =
       (pSVar7->subquery).
       super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
       .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl;
  (pSVar7->subquery).
  super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t.
  super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>.
  super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl = _Var5._M_head_impl;
  if (_Var2._M_head_impl != (SelectStatement *)0x0) {
    (**(code **)(*(long *)&(_Var2._M_head_impl)->super_SQLStatement + 8))();
  }
  if (local_38._M_head_impl != (SelectStatement *)0x0) {
    (*((local_38._M_head_impl)->super_SQLStatement)._vptr_SQLStatement[1])();
  }
  local_38._M_head_impl = (SelectStatement *)0x0;
  SVar1 = in_RSI[1].super_BaseExpression.type;
  pSVar7 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
           ::operator->(&local_30);
  pSVar7->subquery_type = SVar1;
  if (in_RSI[1].super_BaseExpression.alias._M_dataplus._M_p == (pointer)0x0) {
    local_28._M_head_impl = (ParsedExpression *)0x0;
  }
  else {
    pPVar9 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                           *)&in_RSI[1].super_BaseExpression.alias);
    (*(pPVar9->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_28,pPVar9);
  }
  pSVar7 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
           ::operator->(&local_30);
  _Var6._M_head_impl = local_28._M_head_impl;
  local_28._M_head_impl = (ParsedExpression *)0x0;
  _Var3._M_head_impl =
       (pSVar7->child).
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  (pSVar7->child).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var6._M_head_impl;
  if (_Var3._M_head_impl != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))();
    if (local_28._M_head_impl != (ParsedExpression *)0x0) {
      (*((local_28._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
  }
  sVar4 = in_RSI[1].super_BaseExpression.alias._M_string_length;
  pSVar7 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
           ::operator->(&local_30);
  pSVar7->comparison_type = (ExpressionType)sVar4;
  (this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)
       local_30.
       super_unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::SubqueryExpression_*,_std::default_delete<duckdb::SubqueryExpression>_>
       .super__Head_base<0UL,_duckdb::SubqueryExpression_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> SubqueryExpression::Copy() const {
	auto copy = make_uniq<SubqueryExpression>();
	copy->CopyProperties(*this);
	copy->subquery = unique_ptr_cast<SQLStatement, SelectStatement>(subquery->Copy());
	copy->subquery_type = subquery_type;
	copy->child = child ? child->Copy() : nullptr;
	copy->comparison_type = comparison_type;
	return std::move(copy);
}